

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall Parser::~Parser(Parser *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  pDVar1 = (this->m_provider).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_provider).d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_includeDirs).d);
  pDVar2 = (this->m_offsets).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_offsets).d.d)->super_QArrayData,0x18,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_metadata).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_prefixes).d);
  QArrayDataPointer<Replace>::~QArrayDataPointer(&(this->m_replaces).d);
  QArrayDataPointer<Point>::~QArrayDataPointer(&(this->m_points).d);
  QArrayDataPointer<Function>::~QArrayDataPointer((QArrayDataPointer<Function> *)this);
  return;
}

Assistant:

Parser(const QString &provider)
        : m_provider(provider)
    {

    }